

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<const_solitaire::piles::interfaces::StockPile_&> *
testing::internal::ActionResultHolder<solitaire::piles::interfaces::StockPile_const&>::
PerformAction<solitaire::piles::interfaces::StockPile_const&()>
          (Action<const_solitaire::piles::interfaces::StockPile_&()> *action,ArgumentTuple *args)

{
  ActionResultHolder<const_solitaire::piles::interfaces::StockPile_&> *pAVar1;
  Result pSVar2;
  
  pAVar1 = (ActionResultHolder<const_solitaire::piles::interfaces::StockPile_&> *)operator_new(0x10)
  ;
  pSVar2 = Action<const_solitaire::piles::interfaces::StockPile_&()>::Perform(action);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002e97c8;
  (pAVar1->result_).value_ptr_ = pSVar2;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }